

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O0

AlphaVector * __thiscall
AlphaVectorWeighted::BeliefBackup
          (AlphaVectorWeighted *this,JointBeliefInterface *b,Index a,GaoVectorSet *G,
          QFunctionsDiscrete *Q)

{
  uint uVar1;
  undefined8 uVar2;
  const_reference this_00;
  const_reference pvVar3;
  reference pvVar4;
  uint in_ECX;
  AlphaVectorPOMDP *in_RDX;
  long in_RSI;
  AlphaVector *in_RDI;
  undefined8 in_R8;
  GaoVectorSet *in_R9;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint i;
  double w;
  vector<double,_std::allocator<double>_> valuesWeighted;
  AlphaVector alphaBG;
  AlphaVector alphaPOMDP;
  AlphaVector *alphaWeighted;
  Index in_stack_fffffffffffffe7c;
  AlphaVector *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  AlphaVector *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  E *in_stack_fffffffffffffeb0;
  double dVar10;
  QFunctionsDiscrete *in_stack_fffffffffffffeb8;
  uint local_dc;
  vector<double,_std::allocator<double>_> local_c0 [2];
  AlphaVector local_90;
  ValueFunctionPOMDPDiscrete *in_stack_ffffffffffffff98;
  GaoVectorSet *in_stack_ffffffffffffffa0;
  Index in_stack_ffffffffffffffac;
  JointBeliefInterface *in_stack_ffffffffffffffb0;
  AlphaVectorBG *in_stack_ffffffffffffffb8;
  BGBackupType type;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RSI + 0x20) & 1) != 0) {
    AlphaVectorPOMDP::BeliefBackup
              (in_RDX,(JointBeliefInterface *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               (Index)((ulong)in_R8 >> 0x20),in_R9);
    type = (BGBackupType)in_R9;
    AlphaVectorPlanning::QFunctionsToValueFunction(in_stack_fffffffffffffeb8);
    AlphaVectorBG::BeliefBackup
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,type);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    AlphaVector::GetNrValues((AlphaVector *)0x9582c2);
    std::allocator<double>::allocator((allocator<double> *)0x9582f1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
               (size_type)in_stack_fffffffffffffe98,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
               ,in_stack_fffffffffffffe88);
    std::allocator<double>::~allocator((allocator<double> *)0x95831f);
    for (local_dc = 0; uVar1 = AlphaVector::GetNrValues((AlphaVector *)0x958342), local_dc != uVar1;
        local_dc = local_dc + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)(in_RSI + 0x40),(ulong)in_ECX);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_dc);
      dVar6 = *pvVar3;
      dVar10 = dVar6;
      dVar5 = AlphaVector::GetValue(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      in_stack_fffffffffffffea0 = (AlphaVector *)(1.0 - dVar6);
      dVar6 = AlphaVector::GetValue(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar10;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (double)in_stack_fffffffffffffea0 * dVar6;
      auVar7 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
      in_stack_fffffffffffffe98 = auVar7._0_8_;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_c0,(ulong)local_dc);
      *pvVar4 = (value_type)in_stack_fffffffffffffe98;
    }
    uVar1 = AlphaVector::GetNrValues((AlphaVector *)0x9584fb);
    AlphaVector::AlphaVector(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    AlphaVector::SetValues(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    AlphaVector::SetAction(in_RDI,in_ECX);
    AlphaVector::GetBetaI(&local_90);
    AlphaVector::SetBetaI(in_stack_fffffffffffffea0,(BGPolicyIndex)in_stack_fffffffffffffe98);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar1,in_stack_fffffffffffffe90))
    ;
    AlphaVector::~AlphaVector((AlphaVector *)0x9585cb);
    AlphaVector::~AlphaVector((AlphaVector *)0x9585d8);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

AlphaVector
AlphaVectorWeighted::BeliefBackup(const JointBeliefInterface &b,
                                  Index a,
                                  const GaoVectorSet &G,
                                  const QFunctionsDiscrete &Q) const
{
    if(!_m_initialized)
        throw(E("AlphaVectorWeighted::BeliefBackup not initialized"));

    AlphaVector alphaPOMDP=AlphaVectorPOMDP::BeliefBackup(b,a,G);
    AlphaVector alphaBG=
        AlphaVectorBG::BeliefBackup(b,a,G,
                                    QFunctionsToValueFunction(Q),
                                    BGIP_SOLVER_EXHAUSTIVE);

    vector<double> valuesWeighted(alphaPOMDP.GetNrValues(),0);
    double w;
#if 0
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
        valuesWeighted[i]=(_m_weights[i] * alphaPOMDP.GetValue(i) +
                           (1-_m_weights[i]) * alphaBG.GetValue(i));
#else
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
    {
        w=_m_weightsBackProjected[a][i];
        valuesWeighted[i]=(w * alphaPOMDP.GetValue(i) +
                           (1-w) * alphaBG.GetValue(i));
    }
#endif
    AlphaVector alphaWeighted(alphaPOMDP.GetNrValues());
    alphaWeighted.SetValues(valuesWeighted);
    alphaWeighted.SetAction(a);
    alphaWeighted.SetBetaI(alphaBG.GetBetaI());

#if DEBUG_AlphaVectorWeighted
    double Vpomdp=BeliefValue::GetValue(b,alphaPOMDP),
        Vbg=BeliefValue::GetValue(b,alphaBG),
        Vweighted=BeliefValue::GetValue(b,alphaWeighted);

    cout << "AlphaVectorWeighted::BeliefBackup"
         << " for a " << a
#if 0
         << alphaWeighted.GetAction() << " bI "
         << alphaWeighted.GetBetaI() << " Vpomdp " << Vpomdp
         << " Vbg " << Vbg << " Vweighted " << Vweighted
#endif
         << " b " << b.SoftPrint() << " alpha " << alphaWeighted.SoftPrint()
         << endl;
#endif

    return(alphaWeighted);
}